

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall Inline::InlineSpread(Inline *this,Instr *spreadCall)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  AddrOpndKind AVar3;
  ArgSlot AVar4;
  undefined4 *puVar5;
  JITTimeFunctionBody *pJVar6;
  Instr *pIVar7;
  Opnd *pOVar8;
  AddrOpnd *pAVar9;
  SymOpnd *pSVar10;
  StackSym *pSVar11;
  BailOutInstrTemplate<IR::Instr> *this_01;
  RegOpnd *pRVar12;
  RegOpnd *startCallDstOpnd;
  Instr *bailoutInstr;
  Opnd *arrayOpnd;
  StackSym *argLinkSym;
  SymOpnd *argLinkOpnd;
  Instr *argInstr;
  AuxArray<unsigned_int> *spreadIndices;
  Opnd *spreadIndicesOpnd;
  Instr *spreadIndicesInstr;
  Instr *spreadCall_local;
  Inline *this_local;
  
  bVar2 = Lowerer::IsSpreadCall(spreadCall);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x16fe,"(Lowerer::IsSpreadCall(spreadCall))",
                       "Lowerer::IsSpreadCall(spreadCall)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pJVar6 = Func::GetJITFunctionBody(spreadCall->m_func);
  bVar2 = JITTimeFunctionBody::IsInlineSpreadDisabled(pJVar6);
  if (!bVar2) {
    pJVar6 = Func::GetJITFunctionBody(this->topFunc);
    bVar2 = JITTimeFunctionBody::IsInlineSpreadDisabled(pJVar6);
    if (!bVar2) {
      pIVar7 = Lowerer::GetLdSpreadIndicesInstr(spreadCall);
      pOVar8 = IR::Instr::GetSrc1(pIVar7);
      pAVar9 = IR::Opnd::AsAddrOpnd(pOVar8);
      AVar3 = IR::AddrOpnd::GetAddrOpndKind(pAVar9);
      if (AVar3 != AddrOpndKindDynamicAuxBufferRef) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x1709,
                           "(spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef)"
                           ,
                           "spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pAVar9 = IR::Opnd::AsAddrOpnd(pOVar8);
      if (*pAVar9->m_metadata == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0x170c,"(spreadIndices->count > 0)","spreadIndices->count > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      pOVar8 = IR::Instr::GetSrc2(pIVar7);
      pSVar10 = IR::Opnd::AsSymOpnd(pOVar8);
      pSVar11 = Sym::AsStackSym(pSVar10->m_sym);
      this_00 = (pSVar11->field_5).m_instrDef;
      AVar4 = StackSym::GetArgSlotNum(pSVar11);
      if (AVar4 < 3) {
        IR::Instr::ReplaceSrc2(spreadCall,&pSVar10->super_Opnd);
        IR::Instr::Remove(pIVar7);
        pOVar8 = IR::Instr::GetSrc1(this_00);
        this_00->m_opcode = ArgOut_A_SpreadArg;
        this_01 = IR::BailOutInstrTemplate<IR::Instr>::New
                            (BailOnNotSpreadable,BailOutOnInlineFunction,this_00,this_00->m_func);
        IR::Instr::SetSrc1(&this_01->super_Instr,pOVar8);
        IR::Instr::InsertBefore(this_00,&this_01->super_Instr);
        pOVar8 = IR::Instr::GetSrc2(this_00);
        pSVar10 = IR::Opnd::AsSymOpnd(pOVar8);
        pSVar11 = Sym::AsStackSym(pSVar10->m_sym);
        pIVar7 = (pSVar11->field_5).m_instrDef;
        pIVar7->m_opcode = ArgOut_A_Dynamic;
        pOVar8 = IR::Instr::GetSrc2(pIVar7);
        pRVar12 = IR::Opnd::AsRegOpnd(pOVar8);
        pSVar11 = Sym::AsStackSym(&pRVar12->m_sym->super_Sym);
        if (((pSVar11->field_5).m_instrDef)->m_opcode != StartCall) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                             ,0x172e,"(argInstr->m_opcode == Js::OpCode::StartCall)",
                             "argInstr->m_opcode == Js::OpCode::StartCall");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        spreadCall->m_opcode = CallIDynamicSpread;
      }
    }
  }
  return spreadCall;
}

Assistant:

IR::Instr *
Inline::InlineSpread(IR::Instr *spreadCall)
{
    Assert(Lowerer::IsSpreadCall(spreadCall));

    if (spreadCall->m_func->GetJITFunctionBody()->IsInlineSpreadDisabled()
        || this->topFunc->GetJITFunctionBody()->IsInlineSpreadDisabled())
    {
        return spreadCall;
    }

    IR::Instr *spreadIndicesInstr = Lowerer::GetLdSpreadIndicesInstr(spreadCall);

    IR::Opnd *spreadIndicesOpnd = spreadIndicesInstr->GetSrc1();
    Assert(spreadIndicesOpnd->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindDynamicAuxBufferRef);

    Js::AuxArray<uint32>* spreadIndices = static_cast<Js::AuxArray<uint32>*>(spreadIndicesOpnd->AsAddrOpnd()->m_metadata);
    Assert(spreadIndices->count > 0);

    IR::Instr *argInstr = spreadIndicesInstr;

    IR::SymOpnd *argLinkOpnd = argInstr->GetSrc2()->AsSymOpnd();
    StackSym *argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;

    // We only support one spread argument for inlining.
    if (argLinkSym->GetArgSlotNum() > 2)
    {
        return spreadCall;
    }

    // We are now committed to inlining spread. Remove the LdSpreadIndices instr
    // and convert the spread and 'this' ArgOuts.
    spreadCall->ReplaceSrc2(argLinkOpnd);
    spreadIndicesInstr->Remove();

    // Insert the bailout before the array ArgOut
    IR::Opnd *arrayOpnd = argInstr->GetSrc1();
    argInstr->m_opcode = Js::OpCode::ArgOut_A_SpreadArg;
    IR::Instr *bailoutInstr = IR::BailOutInstr::New(Js::OpCode::BailOnNotSpreadable, IR::BailOutOnInlineFunction, argInstr, argInstr->m_func);
    bailoutInstr->SetSrc1(arrayOpnd);
    argInstr->InsertBefore(bailoutInstr);

    argLinkOpnd = argInstr->GetSrc2()->AsSymOpnd();
    argLinkSym  = argLinkOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;
    argInstr->m_opcode = Js::OpCode::ArgOut_A_Dynamic;

    IR::RegOpnd *startCallDstOpnd = argInstr->GetSrc2()->AsRegOpnd();
    argLinkSym = startCallDstOpnd->m_sym->AsStackSym();
    argInstr = argLinkSym->m_instrDef;
    Assert(argInstr->m_opcode == Js::OpCode::StartCall);

    spreadCall->m_opcode = Js::OpCode::CallIDynamicSpread;

    return spreadCall;
}